

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaSN.cpp
# Opt level: O2

void __thiscall OmegaSN::~OmegaSN(OmegaSN *this)

{
  double **ppdVar1;
  double ***pppdVar2;
  uint j;
  ulong uVar3;
  uint i;
  long lVar4;
  uint i_1;
  ulong uVar5;
  
  operator_delete(this->states);
  this->states = (double *)0x0;
  for (lVar4 = 0; ppdVar1 = this->S12P, lVar4 != 3; lVar4 = lVar4 + 1) {
    operator_delete(ppdVar1[lVar4]);
  }
  if (ppdVar1 != (double **)0x0) {
    operator_delete__(ppdVar1);
  }
  this->S12P = (double **)0x0;
  for (uVar5 = 0; uVar5 < this->nbSegments; uVar5 = uVar5 + 1) {
    for (uVar3 = 0; uVar3 < this->nbStates; uVar3 = uVar3 + 1) {
      operator_delete(this->Q[uVar5][uVar3]);
      operator_delete(this->lastChpt[uVar5][uVar3]);
      operator_delete(this->lastIndState[uVar5][uVar3]);
    }
    operator_delete(this->Q[uVar5]);
    operator_delete(this->lastChpt[uVar5]);
    operator_delete(this->lastIndState[uVar5]);
  }
  pppdVar2 = this->Q;
  if (pppdVar2 != (double ***)0x0) {
    operator_delete__(pppdVar2);
  }
  if (this->lastChpt != (uint ***)0x0) {
    operator_delete__(this->lastChpt);
  }
  if (this->lastIndState != (uint ***)0x0) {
    operator_delete__(this->lastIndState);
  }
  this->Q = (double ***)0x0;
  this->lastIndState = (uint ***)0x0;
  this->lastChpt = (uint ***)0x0;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->parameters).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->changepoints).super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

OmegaSN::~OmegaSN()
{
  delete(states);
  states = NULL;
  for(unsigned int i = 0; i < 3; i++){delete(S12P[i]);}
  delete [] S12P;
  S12P = NULL;

  for(unsigned int i = 0; i < nbSegments; i++)
  {
    for(unsigned int j = 0; j < nbStates; j++)
    {
      delete(Q[i][j]);
      delete(lastChpt[i][j]);
      delete(lastIndState[i][j]);
      }
    delete(Q[i]);
    delete(lastChpt[i]);
    delete(lastIndState[i]);
  }
  delete [] Q;
  delete [] lastChpt;
  delete [] lastIndState;
  Q = NULL;
  lastChpt = NULL;
  lastIndState = NULL;
}